

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O3

Vector<kj::ArrayPtr<const_char>_> * __thiscall
kj::_::splitParts(Vector<kj::ArrayPtr<const_char>_> *__return_storage_ptr__,_ *this,
                 ArrayPtr<const_char> input,char delim)

{
  ArrayPtr<const_char> *pAVar1;
  size_t newSize;
  ArrayPtr<const_char> *pAVar2;
  ArrayPtr<const_char> part;
  ArrayPtr<const_char> local_50;
  ArrayPtr<const_char> local_40;
  
  local_40.size_ = (size_t)input.ptr;
  (__return_storage_ptr__->builder).ptr = (ArrayPtr<const_char> *)0x0;
  (__return_storage_ptr__->builder).pos = (RemoveConst<kj::ArrayPtr<const_char>_> *)0x0;
  (__return_storage_ptr__->builder).endPtr = (ArrayPtr<const_char> *)0x0;
  (__return_storage_ptr__->builder).disposer = (ArrayDisposer *)&NullArrayDisposer::instance;
  if ((char *)local_40.size_ != (char *)0x0) {
    pAVar2 = (ArrayPtr<const_char> *)0x0;
    local_40.ptr = (char *)this;
    do {
      local_50 = splitNext(&local_40,(char)input.size_);
      stripLeadingAndTrailingSpace(&local_50);
      if (pAVar2 == (__return_storage_ptr__->builder).endPtr) {
        pAVar1 = (__return_storage_ptr__->builder).ptr;
        newSize = (long)pAVar2 - (long)pAVar1 >> 3;
        if (pAVar2 == pAVar1) {
          newSize = 4;
        }
        Vector<kj::ArrayPtr<const_char>_>::setCapacity(__return_storage_ptr__,newSize);
        pAVar2 = (__return_storage_ptr__->builder).pos;
      }
      pAVar2->ptr = local_50.ptr;
      pAVar2->size_ = local_50.size_;
      pAVar2 = (__return_storage_ptr__->builder).pos + 1;
      (__return_storage_ptr__->builder).pos = pAVar2;
    } while ((char *)local_40.size_ != (char *)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

kj::Vector<kj::ArrayPtr<const char>> splitParts(kj::ArrayPtr<const char> input, char delim) {
  // Given a string `input` and a delimiter `delim`, split the string into a vector of substrings,
  // separated by the delimiter. Note that leading/trailing whitespace is stripped from each element.
  kj::Vector<kj::ArrayPtr<const char>> parts;

  while (input.size() != 0) {
    auto part = splitNext(input, delim);
    stripLeadingAndTrailingSpace(part);
    parts.add(kj::mv(part));
  }

  return parts;
}